

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_avail_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImU32 col;
  ImGuiCol idx;
  long lVar6;
  uint uVar7;
  bool bVar8;
  float fVar9;
  int iVar10;
  undefined1 auVar11 [12];
  float fVar16;
  int iVar17;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  bool local_de;
  bool local_dd;
  float local_dc;
  ImRect local_d8;
  ImGuiAxis local_c4;
  long *local_c0;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  ImVec2 local_58;
  ImVec2 IStack_50;
  undefined1 local_48 [16];
  undefined1 auVar14 [16];
  undefined1 auVar20 [16];
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar9 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar16 = (bb_frame->Max).y - (bb_frame->Min).y;
    if (fVar9 <= 0.0) {
      return false;
    }
    if (fVar16 <= 0.0) {
      return false;
    }
    local_dc = 1.0;
    if (axis == ImGuiAxis_Y) {
      fVar22 = (GImGui->Style).FramePadding.y;
      fVar22 = fVar22 + fVar22;
      if (fVar16 < fVar22 + GImGui->FontSize) {
        fVar22 = (fVar16 - GImGui->FontSize) / fVar22;
        local_dc = 1.0;
        if (fVar22 <= 1.0) {
          local_dc = fVar22;
        }
        local_dc = (float)(~-(uint)(fVar22 < 0.0) & (uint)local_dc);
      }
    }
    uVar28 = 0;
    uVar27 = 0;
    uVar26 = 0;
    if (0.0 < local_dc) {
      iVar10 = (int)((fVar9 + -2.0) * 0.5);
      iVar17 = (int)((fVar16 + -2.0) * 0.5);
      auVar23._0_4_ = -(uint)(iVar10 < 0);
      auVar23._4_4_ = -(uint)(iVar17 < 0);
      auVar23._8_8_ = 0;
      auVar12._0_4_ = -(uint)(3 < iVar10);
      auVar12._4_4_ = -(uint)(3 < iVar17);
      auVar12._8_8_ = 0;
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = CONCAT44((float)iVar17,(float)iVar10) ^ 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar24 = auVar23 & _DAT_00260a60 | ~auVar23 & (auVar12 & _DAT_00256300 | ~auVar12 & auVar24);
      fStack_a0 = auVar24._0_4_;
      fVar16 = auVar24._4_4_;
      auVar18._0_8_ = auVar24._0_8_;
      auVar18._8_4_ = fStack_a0;
      auVar18._12_4_ = fVar16;
      local_d8.Min.x = (bb_frame->Min).x;
      local_d8.Min.y = (bb_frame->Min).y;
      local_d8.Max.x = (bb_frame->Max).x;
      local_d8.Max.y = (bb_frame->Max).y;
      local_a8 = local_d8.Min.x - fStack_a0;
      fVar9 = local_d8.Min.y - fVar16;
      fStack_a0 = local_d8.Max.x + fStack_a0;
      fStack_a4 = local_d8.Max.y + fVar16;
      auVar3._4_8_ = auVar18._8_8_;
      auVar3._0_4_ = local_d8.Min.y + fVar16;
      auVar19._0_8_ = auVar3._0_8_ << 0x20;
      auVar19._8_4_ = fStack_a0;
      auVar19._12_4_ = fStack_a4;
      local_d8.Max = auVar19._8_8_;
      local_d8.Min.y = fVar9;
      local_d8.Min.x = local_a8;
      if (axis != ImGuiAxis_X) {
        fStack_a0 = fStack_a4;
        local_a8 = fVar9;
      }
      local_a8 = fStack_a0 - local_a8;
      lVar6 = size_contents_v - size_avail_v;
      if (lVar6 == 0 || size_contents_v < size_avail_v) {
        size_contents_v = size_avail_v;
      }
      if (size_contents_v < 2) {
        size_contents_v = 1;
      }
      fVar22 = ((float)size_avail_v / (float)size_contents_v) * local_a8;
      fVar9 = (GImGui->Style).GrabMinSize;
      fVar16 = local_a8;
      if (fVar22 <= local_a8) {
        fVar16 = fVar22;
      }
      uVar7 = -(uint)(fVar22 < fVar9);
      local_98 = (float)(uVar7 & (uint)fVar9 | ~uVar7 & (uint)fVar16);
      local_de = false;
      local_dd = false;
      local_c4 = axis;
      local_c0 = p_scroll_v;
      fStack_9c = fStack_a4;
      fStack_94 = fStack_a4;
      fStack_90 = fStack_a0;
      fStack_8c = fStack_a4;
      ItemAdd(bb_frame,id,(ImRect *)0x0,8);
      ButtonBehavior(&local_d8,id,&local_dd,&local_de,0x40000);
      auVar4._8_4_ = fStack_a0;
      auVar4._0_8_ = CONCAT44(fStack_a4,local_a8);
      auVar4._12_4_ = fStack_9c;
      if (lVar6 < 2) {
        lVar6 = 1;
      }
      auVar25._4_4_ = (float)*local_c0;
      auVar25._0_4_ = local_98;
      auVar25._8_4_ = fStack_94;
      auVar25._12_4_ = 0;
      auVar14._8_4_ = fStack_a4;
      auVar14._0_8_ = CONCAT44(fStack_a4,local_a8);
      auVar14._12_4_ = uVar26;
      auVar13._8_8_ = auVar14._8_8_;
      auVar13._4_4_ = (float)lVar6;
      auVar13._0_4_ = local_a8;
      auVar24 = divps(auVar25,auVar13);
      fVar16 = auVar24._4_4_;
      iVar10 = -(uint)(auVar24._0_4_ < 1.0);
      iVar17 = -(uint)(fVar16 < 0.0);
      auVar21._4_4_ = iVar17;
      auVar21._0_4_ = iVar10;
      auVar21._8_4_ = iVar17;
      auVar21._12_4_ = iVar17;
      auVar20._8_8_ = auVar21._8_8_;
      auVar20._4_4_ = iVar10;
      auVar20._0_4_ = iVar10;
      uVar7 = movmskpd((int)local_c0,auVar20);
      fVar9 = 0.0;
      if (((uVar7 & 2) == 0) && (fVar9 = 1.0, fVar16 <= 1.0)) {
        fVar9 = fVar16;
      }
      auVar15._4_12_ = auVar4._4_12_;
      auVar15._0_4_ = local_a8 - local_98;
      local_b8 = (fVar9 * auVar15._0_4_) / local_a8;
      uStack_b4 = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
      if (((1.0 <= local_dc) && ((uVar7 & 1) != 0)) && (local_de != false)) {
        local_48 = auVar15;
        local_78 = (float)lVar6;
        uStack_74 = uVar26;
        uStack_70 = uVar27;
        uStack_6c = uVar28;
        local_68 = auVar24;
        fVar9 = ((pIVar5->IO).NavInputs[(long)local_c4 + 0x10] - (&local_d8.Min.x)[local_c4]) /
                local_a8;
        auVar11 = ZEXT812(0x3f800000);
        if (fVar9 <= 1.0) {
          auVar11._4_8_ = 0;
          auVar11._0_4_ = fVar9;
        }
        local_88._4_4_ = 0;
        local_88._0_4_ = ~-(uint)(fVar9 < 0.0) & auVar11._0_4_;
        local_88._8_4_ = auVar11._8_4_;
        local_88._12_4_ = 0;
        SetHoveredID(id);
        if (pIVar5->ActiveIdIsJustActivated == true) {
          bVar2 = (float)local_68._0_4_ + local_b8 < (float)local_88._0_4_;
          bVar8 = bVar2 || (float)local_88._0_4_ < local_b8;
          fVar9 = 0.0;
          if (!bVar2 && (float)local_88._0_4_ >= local_b8) {
            fVar9 = (float)local_68._0_4_ * -0.5 + ((float)local_88._0_4_ - local_b8);
          }
          pIVar5->ScrollbarClickDeltaToGrabCenter = fVar9;
        }
        else {
          bVar8 = false;
        }
        fVar16 = ((float)local_68._0_4_ * -0.5 +
                 ((float)local_88._0_4_ - pIVar5->ScrollbarClickDeltaToGrabCenter)) /
                 (1.0 - (float)local_68._0_4_);
        fVar9 = 1.0;
        if (fVar16 <= 1.0) {
          fVar9 = fVar16;
        }
        lVar6 = (long)((float)(~-(uint)(fVar16 < 0.0) & (uint)fVar9) * local_78);
        *local_c0 = lVar6;
        fVar16 = (float)lVar6 / local_78;
        fVar9 = 1.0;
        if (fVar16 <= 1.0) {
          fVar9 = fVar16;
        }
        local_b8 = ((float)local_48._0_4_ * (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar9)) /
                   local_a8;
        uStack_b4 = local_48._4_4_;
        uStack_b0 = local_48._8_4_;
        uStack_ac = local_48._12_4_;
        if (bVar8) {
          pIVar5->ScrollbarClickDeltaToGrabCenter =
               -(float)local_68._0_4_ * 0.5 + ((float)local_88._0_4_ - local_b8);
        }
      }
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (local_de == false) {
        idx = (local_dd & 1) + 0xf;
      }
      local_dc = (float)GetColorU32(idx,local_dc);
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar1->WindowRounding,flags);
      if (local_c4 == ImGuiAxis_X) {
        local_58.x = local_d8.Min.x + (local_d8.Max.x - local_d8.Min.x) * local_b8;
        IStack_50.x = local_98 + local_58.x;
        IStack_50.y = local_d8.Max.y;
        local_58.y = local_d8.Min.y;
      }
      else {
        local_58.y = (local_d8.Max.y - local_d8.Min.y) * local_b8 + local_d8.Min.y;
        IStack_50.y = local_98 + local_58.y;
        IStack_50.x = local_d8.Max.x;
        local_58.x = local_d8.Min.x;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_58,&IStack_50,(ImU32)local_dc,
                 (pIVar5->Style).ScrollbarRounding,0);
      return local_de;
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_avail_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_avail_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ItemAdd(bb_frame, id, NULL, ImGuiItemFlags_NoNav);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}